

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed64(UnknownFieldSet *this,int number,uint64 value)

{
  vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *this_00;
  iterator __position;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  UnknownField field;
  UnknownField local_18;
  
  local_18.type_ = 2;
  local_18.number_ = number;
  local_18.data_.varint_ = value;
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    pvVar1 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)operator_new(0x18);
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar1->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->fields_ = pvVar1;
  }
  this_00 = (vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>> *
            )this->fields_;
  __position._M_current = *(UnknownField **)(this_00 + 8);
  if (__position._M_current == *(UnknownField **)(this_00 + 0x10)) {
    std::vector<google::protobuf::UnknownField,std::allocator<google::protobuf::UnknownField>>::
    _M_realloc_insert<google::protobuf::UnknownField_const&>(this_00,__position,&local_18);
  }
  else {
    (__position._M_current)->number_ = local_18.number_;
    (__position._M_current)->type_ = local_18.type_;
    ((__position._M_current)->data_).varint_ = (uint64)local_18.data_;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
  }
  return;
}

Assistant:

void UnknownFieldSet::AddFixed64(int number, uint64 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED64);
  field.data_.fixed64_ = value;
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
}